

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascDecrypt.cpp
# Opt level: O0

int CascDirectCopy(LPBYTE pbOutBuffer,PDWORD pcbOutBuffer,LPBYTE pbInBuffer,DWORD cbInBuffer)

{
  DWORD cbInBuffer_local;
  LPBYTE pbInBuffer_local;
  PDWORD pcbOutBuffer_local;
  LPBYTE pbOutBuffer_local;
  
  if (*pcbOutBuffer < cbInBuffer - 1) {
    pbOutBuffer_local._4_4_ = 0x69;
  }
  else {
    memcpy(pbOutBuffer,pbInBuffer,(ulong)cbInBuffer);
    *pcbOutBuffer = cbInBuffer;
    pbOutBuffer_local._4_4_ = 0;
  }
  return pbOutBuffer_local._4_4_;
}

Assistant:

int CascDirectCopy(LPBYTE pbOutBuffer, PDWORD pcbOutBuffer, LPBYTE pbInBuffer, DWORD cbInBuffer)
{
    // Check the buffer size
    if((cbInBuffer - 1) > pcbOutBuffer[0])
        return ERROR_INSUFFICIENT_BUFFER;

    // Copy the data
    memcpy(pbOutBuffer, pbInBuffer, cbInBuffer);
    pcbOutBuffer[0] = cbInBuffer;
    return ERROR_SUCCESS;
}